

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprpc.cpp
# Opt level: O0

bool StartHTTPRPC(any *context)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  event_base *peVar4;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000050;
  event_base *eventBase;
  anon_class_16_1_bc11688f handle_rpc;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>
  *in_stack_fffffffffffffeb8;
  anon_class_16_1_bc11688f *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  event_base **in_stack_fffffffffffffed0;
  HTTPRequestHandler *in_stack_fffffffffffffee8;
  HTTPRequestHandler *handler;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 exactMatch;
  bool local_d9;
  ConstevalFormatString<0U> in_stack_ffffffffffffff58;
  string_view in_stack_ffffffffffffff60;
  string_view in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_79 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
               (char *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffea8 = 1;
    in_stack_fffffffffffffeb0 = "Starting HTTP RPC server\n";
    LogPrintFormatInternal<>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60,(int)((ulong)in_RDI >> 0x20),
               0x1d3c2ae,in_stack_00000050,in_stack_ffffffffffffff58);
  }
  exactMatch = (undefined1)((ulong)in_RDI >> 0x38);
  bVar1 = InitRPCAuthentication();
  if (bVar1) {
    std::any::any((any *)in_stack_fffffffffffffeb0,
                  (any *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    this = local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (allocator<char> *)in_stack_fffffffffffffee8);
    std::function<bool(HTTPRequest*,std::__cxx11::string_const&)>::
    function<StartHTTPRPC(std::any_const&)::__0&,void>
              ((function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
    RegisterHTTPHandler((string *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                        (bool)exactMatch,in_stack_fffffffffffffee8);
    std::
    function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    uVar3 = (**g_wallet_init_interface->_vptr_WalletInitInterface)();
    uVar2 = (undefined1)uVar3;
    if ((uVar3 & 1) != 0) {
      handler = (HTTPRequestHandler *)&stack0xffffffffffffff5f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)CONCAT17(uVar2,in_stack_fffffffffffffef0),(allocator<char> *)handler);
      std::function<bool(HTTPRequest*,std::__cxx11::string_const&)>::
      function<StartHTTPRPC(std::any_const&)::__0&,void>
                ((function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
      RegisterHTTPHandler((string *)CONCAT17(uVar2,in_stack_fffffffffffffef0),(bool)exactMatch,
                          handler);
      std::
      function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function((function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
    }
    peVar4 = EventBase();
    if (peVar4 == (event_base *)0x0) {
      __assert_fail("eventBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httprpc.cpp"
                    ,0x173,"bool StartHTTPRPC(const std::any &)");
    }
    std::make_unique<HTTPRPCTimerInterface,event_base*&>(in_stack_fffffffffffffed0);
    std::unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>::operator=
              (in_stack_fffffffffffffeb8,
               (unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_> *)
               in_stack_fffffffffffffeb0);
    std::unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>::~unique_ptr
              (in_stack_fffffffffffffeb8);
    std::unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>::get
              ((unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    RPCSetTimerInterface
              ((RPCTimerInterface *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    local_d9 = true;
    StartHTTPRPC(std::any_const&)::$_0::~__0
              ((anon_class_16_1_bc11688f *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    local_d9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_d9;
}

Assistant:

bool StartHTTPRPC(const std::any& context)
{
    LogDebug(BCLog::RPC, "Starting HTTP RPC server\n");
    if (!InitRPCAuthentication())
        return false;

    auto handle_rpc = [context](HTTPRequest* req, const std::string&) { return HTTPReq_JSONRPC(context, req); };
    RegisterHTTPHandler("/", true, handle_rpc);
    if (g_wallet_init_interface.HasWalletSupport()) {
        RegisterHTTPHandler("/wallet/", false, handle_rpc);
    }
    struct event_base* eventBase = EventBase();
    assert(eventBase);
    httpRPCTimerInterface = std::make_unique<HTTPRPCTimerInterface>(eventBase);
    RPCSetTimerInterface(httpRPCTimerInterface.get());
    return true;
}